

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_add_between
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_INT RVar1;
  REF_GEOM pRVar2;
  REF_INT *pRVar3;
  REF_NODE pRVar4;
  REF_DBL *pRVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  REF_DBL RVar10;
  REF_DBL RVar11;
  REF_DBL RVar12;
  REF_DBL RVar13;
  REF_DBL RVar14;
  REF_DBL RVar15;
  REF_STATUS ref_private_macro_code_rss;
  uint uVar16;
  uint uVar17;
  REF_STATUS RVar18;
  ulong uVar19;
  undefined8 uVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  int iVar24;
  REF_CELL pRVar25;
  bool bVar26;
  double dVar27;
  REF_NODE pRVar28;
  REF_NODE in_XMM0_Qb;
  REF_GRID pRVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  REF_GRID pRVar39;
  double dVar40;
  undefined1 auVar41 [16];
  ulong uStackY_340;
  double local_318;
  uint local_30c;
  REF_CELL local_308;
  REF_DBL RStack_300;
  REF_NODE local_2f8;
  REF_NODE pRStack_2f0;
  REF_GRID local_2e0;
  REF_INT face_geom;
  REF_INT ncell;
  REF_INT cell;
  REF_INT edge_geom;
  double local_2c8;
  double dStack_2c0;
  REF_CELL local_2b8;
  double dStack_2b0;
  REF_GRID local_2a0;
  REF_GRID local_298;
  double dStack_290;
  REF_BOOL support1;
  REF_INT geom1;
  REF_INT geom0;
  REF_BOOL supported;
  REF_INT ncell_1;
  REF_INT sense;
  REF_INT id;
  REF_NODE local_268;
  REF_NODE pRStack_260;
  REF_DBL dx1 [3];
  REF_INT cells_1 [2];
  REF_DBL mid_t;
  double dStack_230;
  REF_DBL param1 [2];
  REF_DBL param0 [2];
  REF_DBL r1;
  REF_DBL r0;
  REF_BOOL support0;
  REF_INT cells [2];
  double local_1b8;
  double dStack_1b0;
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_INT nodes [27];
  REF_DBL dx0 [3];
  REF_DBL xyz [3];
  
  local_2f8 = ref_grid->node;
  pRVar2 = ref_grid->geom;
  local_268 = (REF_NODE)node1_weight;
  pRStack_260 = in_XMM0_Qb;
  ref_geom_supported(pRVar2,node0,&support0);
  ref_geom_supported(pRVar2,node1,&support1);
  if (support0 == 0) {
    return 0;
  }
  if (support1 == 0) {
    return 0;
  }
  local_2c8 = 1.0 - (double)local_268;
  dStack_2c0 = 0.0;
  pRVar25 = ref_grid->cell[0];
  nodes[0] = node0;
  nodes[1] = node1;
  uVar16 = ref_cell_with(pRVar25,nodes,&cell);
  if (uVar16 == 5) {
    edge_geom = -1;
  }
  else {
    if (uVar16 != 0) {
      pcVar22 = "search for edg";
      uVar20 = 0x4b9;
      uStackY_340 = (ulong)uVar16;
      uVar17 = uVar16;
      goto LAB_00142051;
    }
    uVar17 = ref_cell_nodes(pRVar25,cell,nodes);
    if (uVar17 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4ba,
             "ref_geom_add_between",(ulong)uVar17,"get id");
      return uVar17;
    }
    RVar1 = nodes[pRVar25->node_per];
    uVar17 = ref_geom_cell_tuv(pRVar2,node0,nodes,1,param0,(REF_INT *)&local_30c);
    if (uVar17 != 0) {
      pcVar22 = "cell uv";
      uVar20 = 0x4be;
      goto LAB_001420bb;
    }
    uVar17 = ref_geom_cell_tuv(pRVar2,node1,nodes,1,param1,(REF_INT *)&local_30c);
    if (uVar17 != 0) {
      pcVar22 = "cell uv";
      uVar20 = 0x4c0;
      goto LAB_001420bb;
    }
    local_308 = (REF_CELL)(local_2c8 * param0[0] + param1[0] * (double)local_268);
    local_298 = (REF_GRID)param0[0];
    dStack_2b0 = dStack_2c0;
    local_2e0 = (REF_GRID)param1[0];
    local_2b8 = local_308;
    if ((pRVar2->model != (void *)0x0) &&
       (uVar17 = ref_egads_inverse_eval
                           (pRVar2,1,RVar1,local_2f8->real + new_node * 0xf,(REF_DBL *)&local_308),
       uVar17 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4c5,
             "ref_geom_add_between",(ulong)uVar17,"inv eval edge");
      ref_geom_tec(ref_grid,"ref_geom_split_edge.tec");
      return uVar17;
    }
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_298;
    pRVar39 = local_298;
    if ((double)local_2e0 <= (double)local_298) {
      pRVar39 = local_2e0;
    }
    if ((double)local_308 < (double)pRVar39) {
LAB_001427ef:
      local_308 = local_2b8;
    }
    else {
      pRVar29 = local_298;
      if ((double)local_298 <= (double)local_2e0) {
        pRVar29 = local_2e0;
      }
      if ((double)pRVar29 < (double)local_308) goto LAB_001427ef;
    }
    if (pRVar2->model != (void *)0x0) {
      local_2a0 = pRVar39;
      uVar17 = ref_egads_eval_at(pRVar2,1,RVar1,(REF_DBL *)&local_308,xyz,(REF_DBL *)0x0);
      if (uVar17 != 0) {
        pcVar22 = "eval";
        uVar20 = 0x4cf;
        goto LAB_001420bb;
      }
      pRVar5 = local_2f8->real;
      for (lVar21 = 0; RVar15 = dx0[2], RVar14 = dx0[1], RVar13 = dx0[0], lVar21 != 3;
          lVar21 = lVar21 + 1) {
        dx0[lVar21] = pRVar5[node0 * 0xf + lVar21] - xyz[lVar21];
      }
      for (lVar21 = 0; RVar12 = dx1[2], RVar11 = dx1[1], RVar10 = dx1[0], lVar21 != 3;
          lVar21 = lVar21 + 1) {
        dx1[lVar21] = pRVar5[node1 * 0xf + lVar21] - xyz[lVar21];
      }
      mid_t = (REF_DBL)local_2b8;
      uVar17 = ref_egads_eval_at(pRVar2,1,RVar1,&mid_t,xyz,(REF_DBL *)0x0);
      if (uVar17 != 0) {
        pcVar22 = "eval";
        uVar20 = 0x4dd;
        goto LAB_001420bb;
      }
      auVar6._8_8_ = RVar12 * RVar12 + RVar10 * RVar10 + RVar11 * RVar11;
      auVar6._0_8_ = RVar15 * RVar15 + RVar13 * RVar13 + RVar14 * RVar14;
      auVar33 = sqrtpd(auVar33,auVar6);
      dVar31 = auVar33._0_8_;
      dVar30 = auVar33._8_8_ + dVar31;
      dVar36 = dVar30 * 1e+20;
      if (dVar36 <= -dVar36) {
        dVar36 = -dVar36;
      }
      dVar27 = dVar31;
      if (dVar31 <= -dVar31) {
        dVar27 = -dVar31;
      }
      pRVar5 = local_2f8->real;
      for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
        dx0[lVar21] = pRVar5[node0 * 0xf + lVar21] - xyz[lVar21];
      }
      for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
        dx1[lVar21] = pRVar5[node1 * 0xf + lVar21] - xyz[lVar21];
      }
      auVar34._0_8_ = dx0[1] * dx0[1];
      auVar34._8_8_ = dx1[1] * dx1[1];
      auVar8._8_8_ = dx1[2] * dx1[2] + dx1[0] * dx1[0] + auVar34._8_8_;
      auVar8._0_8_ = dx0[2] * dx0[2] + dx0[0] * dx0[0] + auVar34._0_8_;
      auVar33 = sqrtpd(auVar34,auVar8);
      dVar32 = auVar33._0_8_;
      dVar37 = auVar33._8_8_ + dVar32;
      dVar38 = dVar37 * 1e+20;
      if (dVar38 <= -dVar38) {
        dVar38 = -dVar38;
      }
      dVar40 = dVar32;
      if (dVar32 <= -dVar32) {
        dVar40 = -dVar32;
      }
      auVar41._0_8_ =
           (double)(~-(ulong)(dVar40 < dVar38) & 0xbff0000000000000 |
                   (ulong)(dVar32 / dVar37) & -(ulong)(dVar40 < dVar38)) - (double)local_268;
      auVar41._8_8_ =
           (double)(~-(ulong)(dVar27 < dVar36) & 0xbff0000000000000 |
                   (ulong)(dVar31 / dVar30) & -(ulong)(dVar27 < dVar36)) - (double)local_268;
      auVar9._8_8_ = -auVar41._8_8_;
      auVar9._0_8_ = -auVar41._0_8_;
      auVar33 = maxpd(auVar41,auVar9);
      pRVar39 = local_2a0;
      if (auVar33._0_8_ < auVar33._8_8_) {
        local_308 = (REF_CELL)mid_t;
      }
    }
    if ((double)local_308 < (double)pRVar39) {
LAB_00142ca7:
      local_308 = local_2b8;
    }
    else {
      pRVar39 = local_298;
      if ((double)local_298 <= (double)local_2e0) {
        pRVar39 = local_2e0;
      }
      if ((double)pRVar39 < (double)local_308) goto LAB_00142ca7;
    }
    uVar17 = ref_geom_add(pRVar2,new_node,1,RVar1,(REF_DBL *)&local_308);
    if (uVar17 != 0) {
      pcVar22 = "new geom";
      uVar20 = 0x4f2;
      goto LAB_001420bb;
    }
    uVar17 = ref_geom_find(pRVar2,new_node,1,RVar1,&edge_geom);
    if (uVar17 != 0) {
      pcVar22 = "find the new edge for later face uv evaluation";
      uVar20 = 0x4f5;
      goto LAB_001420bb;
    }
  }
  pRVar25 = ref_grid->cell[3];
  uVar17 = ref_cell_list_with2(pRVar25,node0,node1,2,&ncell,cells);
  if (uVar17 != 0) {
    pcVar22 = "list";
    uVar20 = 0x4fa;
LAB_001420bb:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar20,
           "ref_geom_add_between",(ulong)uVar17,pcVar22);
    return uVar17;
  }
  uVar19 = (ulong)ncell;
  if (uVar19 == 0) {
    return 0;
  }
  local_2b8 = pRVar25;
  local_298 = ref_grid;
  if ((ncell != 2) && (pRVar2->manifold != 0)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x504,
           "ref_geom_add_between","expected two tri for between",2,uVar19);
    ref_geom_tattle(pRVar2,node0);
    ref_geom_tattle(pRVar2,node1);
    pRVar4 = local_2f8;
    ref_node_location(local_2f8,node0);
    ref_node_location(pRVar4,node1);
    return 1;
  }
  local_2e0 = (REF_GRID)((long)edge_geom * 6 + 1);
  local_2a0 = (REF_GRID)((long)edge_geom * 2);
  dStack_2c0 = local_2c8;
  local_2f8 = local_268;
  pRStack_2f0 = local_268;
  for (lVar21 = 0; lVar21 < (int)uVar19; lVar21 = lVar21 + 1) {
    cell = cells[lVar21];
    uVar17 = ref_cell_nodes(pRVar25,cell,nodes);
    if (uVar17 != 0) {
      pcVar22 = "get id";
      uVar20 = 0x508;
LAB_00142881:
      uStackY_340 = (ulong)uVar17;
      goto LAB_00142051;
    }
    uVar17 = ref_geom_tri_supported(pRVar2,nodes,&supported);
    if (uVar17 != 0) {
      pcVar22 = "tri support";
      uVar20 = 0x50a;
      goto LAB_00142881;
    }
    if (supported == 0) goto LAB_001424c6;
    RVar1 = nodes[pRVar25->node_per];
    uVar17 = ref_geom_cell_tuv(pRVar2,node0,nodes,2,param0,(REF_INT *)&local_30c);
    if (uVar17 != 0) {
      pcVar22 = "cell uv";
      uVar20 = 0x510;
      goto LAB_00142881;
    }
    uVar17 = ref_geom_cell_tuv(pRVar2,node1,nodes,2,param1,(REF_INT *)&local_30c);
    if (uVar17 != 0) {
      pcVar22 = "cell uv";
      uVar20 = 0x512;
      goto LAB_00142881;
    }
    local_308 = (REF_CELL)(param0[0] * local_2c8 + param1[0] * (double)local_2f8);
    RStack_300 = param0[1] * dStack_2c0 + param1[1] * (double)pRStack_2f0;
    uVar17 = ref_geom_add(pRVar2,new_node,2,RVar1,(REF_DBL *)&local_308);
    if (uVar17 != 0) {
      pcVar22 = "new geom";
      uVar20 = 0x516;
      goto LAB_00142881;
    }
    uVar17 = ref_geom_find(pRVar2,new_node,2,RVar1,&face_geom);
    if (uVar17 != 0) {
      pcVar22 = "new face geom";
      uVar20 = 0x518;
      goto LAB_00142881;
    }
    uVar17 = ref_geom_find(pRVar2,node0,2,RVar1,&geom0);
    if (uVar17 != 0) {
      pcVar22 = "face geom";
      uVar20 = 0x51a;
      goto LAB_00142881;
    }
    uVar17 = ref_geom_find(pRVar2,node1,2,RVar1,&geom1);
    pRVar25 = local_2b8;
    RVar1 = face_geom;
    if (uVar17 != 0) {
      pcVar22 = "face geom";
      uVar20 = 0x51b;
      goto LAB_00142881;
    }
    pRVar3 = pRVar2->descr;
    iVar24 = pRVar3[(long)geom0 * 6 + 3];
    if ((iVar24 != 0) && (iVar24 == pRVar3[(long)geom1 * 6 + 3])) {
      pRVar3[(long)face_geom * 6 + 3] = iVar24;
    }
    if ((uVar16 != 5) && (pRVar2->model != (void *)0x0)) {
      lVar23 = (long)face_geom;
      local_30c = (uint)(pRVar3[(long)(face_geom * 6) + 3] != 0);
      uVar17 = ref_egads_edge_face_uv
                         (pRVar2,pRVar3[(long)local_2e0],pRVar3[lVar23 * 6 + 1],local_30c,
                          pRVar2->param[(long)local_2a0],(REF_DBL *)&local_308);
      if (uVar17 != 0) {
        pcVar22 = "edge t param";
        uVar20 = 0x52c;
        goto LAB_00142881;
      }
      pRVar5 = pRVar2->param;
      pRVar5[lVar23 * 2] = (REF_DBL)local_308;
      pRVar5[RVar1 * 2 + 1] = RStack_300;
    }
LAB_001424c6:
    uVar19 = (ulong)(uint)ncell;
  }
  if (uVar16 != 5) {
    return 0;
  }
  if (pRVar2->model == (void *)0x0) {
    return 0;
  }
  pRVar4 = local_298->node;
  pRVar25 = local_298->cell[3];
  pRVar2 = local_298->geom;
  uVar16 = ref_geom_unique_id(pRVar2,new_node,2,&id);
  if (uVar16 == 0) {
    uVar16 = ref_cell_list_with2(pRVar25,node0,node1,2,&ncell_1,cells_1);
    if (uVar16 != 0) {
      pcVar22 = "list";
      uVar20 = 0x463;
      goto LAB_001428d6;
    }
    if ((long)ncell_1 == 2) {
      uVar16 = ref_cell_nodes(pRVar25,cells_1[0],(REF_INT *)xyz);
      if (uVar16 != 0) {
        pcVar22 = "cell nodes";
        uVar20 = 0x465;
        goto LAB_001428d6;
      }
      uVar16 = ref_cell_nodes(pRVar25,cells_1[1],(REF_INT *)dx0);
      if (uVar16 == 0) {
        uVar16 = ref_geom_cell_tuv(pRVar2,node0,(REF_INT *)xyz,2,uv0,&sense);
        if (uVar16 == 0) {
          uVar16 = ref_geom_cell_tuv(pRVar2,node1,(REF_INT *)xyz,2,uv1,&sense);
          if (uVar16 == 0) {
            local_2b8 = (REF_CELL)uv1[0];
            dStack_2b0 = uv1[1];
            local_298 = (REF_GRID)uv0[0];
            dStack_290 = uv0[1];
            local_1b8 = local_2c8 * uv0[0] + (double)local_2f8 * uv1[0];
            dStack_1b0 = dStack_2c0 * uv0[1] + (double)pRStack_2f0 * uv1[1];
            pRVar5 = pRVar4->real;
            lVar21 = (long)(new_node * 0xf);
            dx1[0] = pRVar5[lVar21];
            dx1[1] = pRVar5[lVar21 + 1];
            dx1[2] = pRVar5[lVar21 + 2];
            RVar18 = ref_egads_invert(pRVar2,2,id,dx1,&local_1b8);
            if ((RVar18 == 0) &&
               (uVar16 = ref_geom_add(pRVar2,new_node,2,id,&local_1b8), uVar16 != 0)) {
              uStackY_340 = (ulong)uVar16;
              pcVar22 = "new geom";
              uVar20 = 0x476;
            }
            else {
              iVar24 = 0;
              local_318 = 1.0;
              local_2c8 = 0.0;
              local_2f8 = local_268;
              pRStack_2f0 = pRStack_260;
              while( true ) {
                dStack_2c0 = 0.0;
                if (iVar24 == -10) {
                  return 0;
                }
                mid_t = (1.0 - (double)local_2f8) * (double)local_298 +
                        (double)local_2f8 * (double)local_2b8;
                dStack_230 = (1.0 - (double)local_2f8) * dStack_290 + (double)local_2f8 * dStack_2b0
                ;
                uVar16 = ref_geom_add(pRVar2,new_node,2,id,&mid_t);
                if (uVar16 != 0) break;
                uVar16 = ref_egads_eval_at(pRVar2,2,id,&mid_t,pRVar4->real + lVar21,(REF_DBL *)0x0);
                if (uVar16 != 0) {
                  uStackY_340 = (ulong)uVar16;
                  pcVar22 = "eval";
                  uVar20 = 0x483;
                  goto LAB_001428db;
                }
                uVar16 = ref_node_ratio(pRVar4,node0,new_node,&r0);
                if (uVar16 != 0) {
                  uStackY_340 = (ulong)uVar16;
                  pcVar22 = "get r0";
                  uVar20 = 0x484;
                  goto LAB_001428db;
                }
                uVar16 = ref_node_ratio(pRVar4,node1,new_node,&r1);
                if (uVar16 != 0) {
                  uStackY_340 = (ulong)uVar16;
                  pcVar22 = "get r1";
                  uVar20 = 0x485;
                  goto LAB_001428db;
                }
                auVar35._0_8_ = (r1 + r0) * 1e+20;
                auVar35._8_8_ = r0;
                auVar7._8_8_ = -r0;
                auVar7._0_8_ = -auVar35._0_8_;
                auVar33 = maxpd(auVar35,auVar7);
                if (auVar33._0_8_ <= auVar33._8_8_) {
                  return 0;
                }
                dVar36 = r0 / (r1 + r0) - (double)local_268;
                bVar26 = iVar24 != 0;
                iVar24 = iVar24 + -1;
                if ((bVar26) &&
                   (((0.0 < local_2c8 && (dVar36 < 0.0)) || ((local_2c8 < 0.0 && (0.0 < dVar36))))))
                {
                  local_318 = local_318 * 0.5;
                }
                dVar30 = 0.05;
                if (dVar36 <= 0.05) {
                  dVar30 = dVar36;
                }
                local_2c8 = -0.05;
                if (-0.05 <= dVar30) {
                  local_2c8 = dVar30;
                }
                dVar36 = local_2c8;
                if (local_2c8 <= -local_2c8) {
                  dVar36 = -local_2c8;
                }
                if (dVar36 < 0.005) {
                  return 0;
                }
                local_2f8 = (REF_NODE)((double)local_2f8 - local_318 * local_2c8);
                pRVar28 = (REF_NODE)0x3fefae147ae147ae;
                if ((double)local_2f8 <= 0.99) {
                  pRVar28 = local_2f8;
                }
                local_2f8 = (REF_NODE)0x3f847ae147ae147b;
                if (0.01 <= (double)pRVar28) {
                  local_2f8 = pRVar28;
                }
                pRStack_2f0 = (REF_NODE)0x0;
              }
              uStackY_340 = (ulong)uVar16;
              pcVar22 = "new geom";
              uVar20 = 0x480;
            }
          }
          else {
            uStackY_340 = (ulong)uVar16;
            pcVar22 = "cell uv1";
            uVar20 = 0x46b;
          }
        }
        else {
          uStackY_340 = (ulong)uVar16;
          pcVar22 = "cell uv0";
          uVar20 = 0x469;
        }
      }
      else {
        uStackY_340 = (ulong)uVar16;
        pcVar22 = "cell nodes";
        uVar20 = 0x466;
      }
      goto LAB_001428db;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x464,
           "ref_geom_add_between_face_interior","expected two tri for box2 nodes",2,(long)ncell_1);
    uStackY_340 = 1;
  }
  else {
    pcVar22 = "unique face id";
    uVar20 = 0x461;
LAB_001428d6:
    uStackY_340 = (ulong)uVar16;
LAB_001428db:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar20,
           "ref_geom_add_between_face_interior",uStackY_340,pcVar22);
  }
  uVar17 = (uint)uStackY_340;
  pcVar22 = "position new node in uv";
  uVar20 = 0x535;
LAB_00142051:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar20,
         "ref_geom_add_between",uStackY_340,pcVar22);
  return uVar17;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_between(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_DBL node1_weight,
                                        REF_INT new_node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT type, id;
  REF_DBL param[2], param0[2], param1[2];
  REF_BOOL has_edge_support, supported;
  REF_INT edge_geom;
  REF_INT sense, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_STATUS status;
  REF_INT i, ncell, cells[2];
  REF_INT face_geom, geom0, geom1;
  REF_BOOL support0, support1;
  REF_DBL node0_weight = 1.0 - node1_weight;

  RSS(ref_geom_supported(ref_geom, node0, &support0), "node0 supported");
  RSS(ref_geom_supported(ref_geom, node1, &support1), "node1 supported");
  if (!support0 || !support1) {
    return REF_SUCCESS;
  }

  /* insert edge geom on edge cell if present */
  nodes[0] = node0;
  nodes[1] = node1;
  ref_cell = ref_grid_edg(ref_grid);
  status = ref_cell_with(ref_cell, nodes, &cell);
  if (REF_NOT_FOUND == status) {
    has_edge_support = REF_FALSE;
    edge_geom = REF_EMPTY;
  } else {
    RSS(status, "search for edg");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");
    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_EDGE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    if (ref_geom_model_loaded(ref_geom))
      RSB(ref_egads_inverse_eval(ref_geom, type, id,
                                 ref_node_xyz_ptr(ref_node, new_node), param),
          "inv eval edge", ref_geom_tec(ref_grid, "ref_geom_split_edge.tec"));
    /* enforce bounding box and use midpoint as full-back */
    if (param[0] < MIN(param0[0], param1[0]) ||
        MAX(param0[0], param1[0]) < param[0])
      param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    if (ref_geom_model_loaded(ref_geom)) { /* check weight and distance ratio */
      REF_DBL xyz[3], dx0[3], dx1[3], d0, d1, total, actual_weight;
      REF_DBL mid_t, mid_weight;
      REF_INT ii;
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, param, xyz, NULL),
          "eval");
      for (ii = 0; ii < 3; ii++)
        dx0[ii] = ref_node_xyz(ref_node, ii, node0) - xyz[ii];
      for (ii = 0; ii < 3; ii++)
        dx1[ii] = ref_node_xyz(ref_node, ii, node1) - xyz[ii];
      d0 = sqrt(ref_math_dot(dx0, dx0));
      d1 = sqrt(ref_math_dot(dx1, dx1));
      total = d0 + d1;
      actual_weight = -1.0;
      if (ref_math_divisible(d0, total)) {
        actual_weight = d0 / total;
      }
      mid_t = node0_weight * param0[0] + node1_weight * param1[0];
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &mid_t, xyz, NULL),
          "eval");
      for (ii = 0; ii < 3; ii++)
        dx0[ii] = ref_node_xyz(ref_node, ii, node0) - xyz[ii];
      for (ii = 0; ii < 3; ii++)
        dx1[ii] = ref_node_xyz(ref_node, ii, node1) - xyz[ii];
      d0 = sqrt(ref_math_dot(dx0, dx0));
      d1 = sqrt(ref_math_dot(dx1, dx1));
      total = d0 + d1;
      mid_weight = -1.0;
      if (ref_math_divisible(d0, total)) {
        mid_weight = d0 / total;
      }
      if (ABS(mid_weight - node1_weight) < ABS(actual_weight - node1_weight)) {
        /* printf("request %f actual %f mid %f\n",
                  node1_weight,actual_weight,mid_weight); */
        param[0] = mid_t;
      }
    }
    if (param[0] < MIN(param0[0], param1[0]) ||
        MAX(param0[0], param1[0]) < param[0])
      param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    has_edge_support = REF_TRUE;
    RSS(ref_geom_find(ref_geom, new_node, type, id, &edge_geom),
        "find the new edge for later face uv evaluation");
  }

  /* insert face between */
  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  if (0 == ncell) { /* volume edge */
    return REF_SUCCESS;
  }
  if (ref_geom_manifold(ref_geom)) {
    REIB(2, ncell, "expected two tri for between", {
      ref_geom_tattle(ref_geom, node0);
      ref_geom_tattle(ref_geom, node1);
      ref_node_location(ref_node, node0);
      ref_node_location(ref_node, node1);
    });
  }
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, skip */

    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_FACE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    param[1] = node0_weight * param0[1] + node1_weight * param1[1];

    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    RSS(ref_geom_find(ref_geom, new_node, type, id, &face_geom),
        "new face geom");

    RSS(ref_geom_find(ref_geom, node0, type, id, &geom0), "face geom");
    RSS(ref_geom_find(ref_geom, node1, type, id, &geom1), "face geom");
    if (0 != ref_geom_jump(ref_geom, geom0) &&
        0 != ref_geom_jump(ref_geom, geom1) &&
        ref_geom_jump(ref_geom, geom0) == ref_geom_jump(ref_geom, geom1)) {
      ref_geom_jump(ref_geom, face_geom) = ref_geom_jump(ref_geom, geom0);
    }

    /* if there is an edge between, set the face uv based on edge t */
    if (ref_geom_model_loaded(ref_geom) && has_edge_support) {
      REF_INT faceid, edgeid;
      REF_DBL t;
      edgeid = ref_geom_id(ref_geom, edge_geom);
      faceid = ref_geom_id(ref_geom, face_geom);
      t = ref_geom_param(ref_geom, 0, edge_geom);
      sense = 0;
      if (0 != ref_geom_jump(ref_geom, face_geom)) sense = 1;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t, param),
          "edge t param");
      ref_geom_param(ref_geom, 0, face_geom) = param[0];
      ref_geom_param(ref_geom, 1, face_geom) = param[1];
    }
  }

  if (ref_geom_model_loaded(ref_geom) && !has_edge_support) {
    RSS(ref_geom_add_between_face_interior(ref_grid, node0, node1, node1_weight,
                                           new_node),
        "position new node in uv");
  }

  return REF_SUCCESS;
}